

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind_pivot.cpp
# Opt level: O2

void duckdb::ExtractPivotAggregateExpression
               (ClientContext *context,ParsedExpression *expr,
               vector<std::reference_wrapper<duckdb::FunctionExpression>,_true> *aggregates)

{
  ExpressionType EVar1;
  FunctionExpression *pFVar2;
  CatalogEntry *pCVar3;
  BinderException *this;
  reference_wrapper<duckdb::FunctionExpression> local_60;
  EntryLookupInfo lookup_info;
  QueryErrorContext local_38;
  
  EVar1 = (expr->super_BaseExpression).type;
  if (EVar1 == FUNCTION) {
    pFVar2 = BaseExpression::Cast<duckdb::FunctionExpression>(&expr->super_BaseExpression);
    QueryErrorContext::QueryErrorContext(&local_38,expr);
    EntryLookupInfo::EntryLookupInfo
              (&lookup_info,AGGREGATE_FUNCTION_ENTRY,&pFVar2->function_name,local_38);
    pCVar3 = Catalog::GetEntry(context,&pFVar2->catalog,&pFVar2->schema,&lookup_info);
    if (pCVar3->type == AGGREGATE_FUNCTION_ENTRY) {
      local_60._M_data = pFVar2;
      ::std::
      vector<std::reference_wrapper<duckdb::FunctionExpression>,std::allocator<std::reference_wrapper<duckdb::FunctionExpression>>>
      ::emplace_back<std::reference_wrapper<duckdb::FunctionExpression>>
                ((vector<std::reference_wrapper<duckdb::FunctionExpression>,std::allocator<std::reference_wrapper<duckdb::FunctionExpression>>>
                  *)aggregates,&local_60);
      return;
    }
    EVar1 = (expr->super_BaseExpression).type;
  }
  if (EVar1 != COLUMN_REF) {
    lookup_info.error_context.query_location.index =
         (optional_idx)
         ::std::
         _Function_handler<void_(duckdb::ParsedExpression_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/tableref/bind_pivot.cpp:90:12)>
         ::_M_invoke;
    lookup_info.at_clause.ptr =
         (BoundAtClause *)
         ::std::
         _Function_handler<void_(duckdb::ParsedExpression_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/duckdb[P]duckdb/src/planner/binder/tableref/bind_pivot.cpp:90:12)>
         ::_M_manager;
    lookup_info._0_8_ = context;
    lookup_info.name = (string *)aggregates;
    ParsedExpressionIterator::EnumerateChildren
              (expr,(function<void_(duckdb::ParsedExpression_&)> *)&lookup_info);
    ::std::_Function_base::~_Function_base((_Function_base *)&lookup_info);
    return;
  }
  this = (BinderException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&lookup_info,
             "Columns can only be referenced within the aggregate of a PIVOT expression",
             (allocator *)&local_60);
  BinderException::BinderException<>(this,expr,(string *)&lookup_info);
  __cxa_throw(this,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void ExtractPivotAggregateExpression(ClientContext &context, ParsedExpression &expr,
                                     vector<reference<FunctionExpression>> &aggregates) {
	if (expr.GetExpressionType() == ExpressionType::FUNCTION) {
		auto &aggr_function = expr.Cast<FunctionExpression>();

		// check if this is an aggregate to ensure it is an aggregate and not a scalar function
		EntryLookupInfo lookup_info(CatalogType::AGGREGATE_FUNCTION_ENTRY, aggr_function.function_name, expr);
		auto &entry = Catalog::GetEntry(context, aggr_function.catalog, aggr_function.schema, lookup_info);
		if (entry.type == CatalogType::AGGREGATE_FUNCTION_ENTRY) {
			// aggregate
			aggregates.push_back(aggr_function);
			return;
		}
	}
	if (expr.GetExpressionType() == ExpressionType::COLUMN_REF) {
		throw BinderException(expr, "Columns can only be referenced within the aggregate of a PIVOT expression");
	}
	ParsedExpressionIterator::EnumerateChildren(
	    expr, [&](ParsedExpression &child) { ExtractPivotAggregateExpression(context, child, aggregates); });
}